

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_signal_size(game_event_type type,wchar_t h,wchar_t w)

{
  undefined1 local_48 [8];
  game_event_data data;
  wchar_t local_10;
  wchar_t w_local;
  wchar_t h_local;
  game_event_type type_local;
  
  local_48._0_4_ = h;
  local_48._4_4_ = w;
  data.explosion.centre.y = w;
  local_10 = h;
  w_local = type;
  game_event_dispatch(type,(game_event_data *)local_48);
  return;
}

Assistant:

void event_signal_size(game_event_type type, int h, int w)
{
	game_event_data data;

	data.size.h = h;
	data.size.w = w;
	game_event_dispatch(type, &data);
}